

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode
          (MoveRegToMemByRegPlusConst *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMoveStatement *this_00;
  CExpression *pCVar1;
  CMemExpression *this_01;
  CBinopExpression *this_02;
  CConstExpression *this_03;
  CTempExpression *this_04;
  CTempExpression *this_05;
  CTemp rightRegister;
  CTemp leftRegister;
  pair<IRT::CTemp,_const_IRT::INode_*> local_c0;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_98;
  CTemp local_70;
  CTemp local_50;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
    if (this_00 == (CMoveStatement *)0x0) {
      return false;
    }
    pCVar1 = CMoveStatement::Target(this_00);
    if (pCVar1 != (CExpression *)0x0) {
      this_01 = (CMemExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
      if (this_01 == (CMemExpression *)0x0) {
        return false;
      }
      pCVar1 = CMemExpression::getAddress(this_01);
      if (pCVar1 != (CExpression *)0x0) {
        this_02 = (CBinopExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
        if (this_02 == (CBinopExpression *)0x0) {
          return false;
        }
        pCVar1 = CBinopExpression::getRightOperand(this_02);
        if (pCVar1 != (CExpression *)0x0) {
          this_03 = (CConstExpression *)
                    __dynamic_cast(pCVar1,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
          if (this_03 == (CConstExpression *)0x0) {
            return false;
          }
          pCVar1 = CBinopExpression::getLeftOperand(this_02);
          if (pCVar1 == (CExpression *)0x0) {
            this_04 = (CTempExpression *)0x0;
          }
          else {
            this_04 = (CTempExpression *)
                      __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          pCVar1 = CMoveStatement::Source(this_00);
          if (pCVar1 == (CExpression *)0x0) {
            this_05 = (CTempExpression *)0x0;
          }
          else {
            this_05 = (CTempExpression *)
                      __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          CTemp::CTemp(&local_50);
          CTemp::CTemp(&local_70);
          if (this_04 == (CTempExpression *)0x0) {
            pCVar1 = CBinopExpression::getLeftOperand(this_02);
            std::__cxx11::string::string((string *)&local_98,(string *)&local_50);
            local_98.second = pCVar1;
            std::pair<IRT::CTemp,_const_IRT::INode_*>::
            pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_c0,&local_98);
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_98);
          }
          else {
            CTempExpression::getTemprorary(this_04);
            std::__cxx11::string::_M_assign((string *)&local_50);
          }
          if (this_05 == (CTempExpression *)0x0) {
            pCVar1 = CMoveStatement::Source(this_00);
            std::__cxx11::string::string((string *)&local_98,(string *)&local_70);
            local_98.second = pCVar1;
            std::pair<IRT::CTemp,_const_IRT::INode_*>::
            pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_c0,&local_98);
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_98);
          }
          else {
            CTempExpression::getTemprorary(this_05);
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
          local_98.first.name._M_dataplus._M_p._0_4_ = CConstExpression::getValue(this_03);
          std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst,IRT::CTemp&,int,IRT::CTemp&>
                    (&local_c0.first,(int *)&local_50,&local_98.first);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)&local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_c0.first.name._M_string_length);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        if ( memPtr ) {
            ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
            if ( binopPtr ) {
                ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getRightOperand( ));
                if ( constPtr ) {
                    ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
                    ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(movePtr->Source( ));
                    CTemp leftRegister;
                    CTemp rightRegister;
                    if ( !targetRegPtr ) {
                        children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
                    } else {
                        leftRegister = targetRegPtr->getTemprorary( );
                    }
                    if ( !sourceRegPtr ) {
                        children.push_back( std::make_pair( rightRegister, movePtr->Source( )));
                    } else {
                        rightRegister = sourceRegPtr->getTemprorary( );
                    }
                    commands.emplace_back( std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>( leftRegister,
                                                                                                       constPtr->getValue( ),
                                                                                                       rightRegister ));
                    return true;
                }
            }
        }
    }
    return false;
}